

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalculateProbability.cc
# Opt level: O2

JointProbabilityState *
calculateJointProbability
          (JointProbabilityState *__return_storage_ptr__,uint *firstVector,uint *secondVector,
          int vectorLength)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  __ptr = calloc(6,4);
  __ptr_00 = calloc(6,4);
  __ptr_01 = calloc(0x24,4);
  pdVar4 = (double *)calloc(6,8);
  pdVar5 = (double *)calloc(6,8);
  pdVar6 = (double *)calloc(0x24,8);
  uVar7 = 0;
  uVar9 = 0;
  if (0 < vectorLength) {
    uVar9 = (ulong)(uint)vectorLength;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    uVar2 = firstVector[uVar7];
    piVar1 = (int *)((long)__ptr + (ulong)uVar2 * 4);
    *piVar1 = *piVar1 + 1;
    uVar3 = secondVector[uVar7];
    piVar1 = (int *)((long)__ptr_00 + (ulong)uVar3 * 4);
    *piVar1 = *piVar1 + 1;
    piVar1 = (int *)((long)__ptr_01 + (ulong)(uVar3 * 6 + uVar2) * 4);
    *piVar1 = *piVar1 + 1;
  }
  dVar10 = (double)vectorLength;
  for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
    pdVar4[lVar8] = (double)*(int *)((long)__ptr + lVar8 * 4) / dVar10;
  }
  for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
    pdVar5[lVar8] = (double)*(int *)((long)__ptr_00 + lVar8 * 4) / dVar10;
  }
  for (lVar8 = 0; lVar8 != 0x24; lVar8 = lVar8 + 1) {
    pdVar6[lVar8] = (double)*(int *)((long)__ptr_01 + lVar8 * 4) / dVar10;
  }
  __return_storage_ptr__->jointProbabilityVector = pdVar6;
  __return_storage_ptr__->numJointStates = 0x24;
  __return_storage_ptr__->firstProbabilityVector = pdVar4;
  __return_storage_ptr__->numFirstStates = 6;
  __return_storage_ptr__->secondProbabilityVector = pdVar5;
  __return_storage_ptr__->numSecondStates = 6;
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  return __return_storage_ptr__;
}

Assistant:

JointProbabilityState calculateJointProbability(uint *firstVector, uint *secondVector, int vectorLength) {

  int firstNumStates = 6;
  int  secondNumStates = 6;
  int jointNumStates = firstNumStates * secondNumStates;
  
  int *firstStateCounts = (int *) calloc(firstNumStates,sizeof(int));
  int *secondStateCounts = (int *) calloc(secondNumStates,sizeof(int));
  int *jointStateCounts = (int *) calloc(jointNumStates,sizeof(int));
  
  double *firstStateProbs = (double *) calloc(firstNumStates,sizeof(double));
  double *secondStateProbs = (double *) calloc(secondNumStates,sizeof(double));
  double *jointStateProbs = (double *) calloc(jointNumStates,sizeof(double));
    
  /* Optimised for number of FP operations now O(states) instead of O(vectorLength) */
  for (int i = 0; i < vectorLength; ++i) {
    firstStateCounts[firstVector[i]] += 1;
    secondStateCounts[secondVector[i]] += 1;
    jointStateCounts[secondVector[i] * firstNumStates + firstVector[i]] += 1;
  }
  
  double length = vectorLength;
  for (int i = 0; i < firstNumStates; ++i) {
    firstStateProbs[i] = firstStateCounts[i] / length;
  }
  
  for (int i = 0; i < secondNumStates; i++) {
    secondStateProbs[i] = secondStateCounts[i] / length;
  }
  
  for (int i = 0; i < jointNumStates; i++) {
    jointStateProbs[i] = jointStateCounts[i] / length;
  }
  
  JointProbabilityState state;
  state.jointProbabilityVector = jointStateProbs;
  state.numJointStates = jointNumStates;
  state.firstProbabilityVector = firstStateProbs;
  state.numFirstStates = firstNumStates;
  state.secondProbabilityVector = secondStateProbs;
  state.numSecondStates = secondNumStates;
  
  free(firstStateCounts);
  free(secondStateCounts);
  free(jointStateCounts);

  return state;
}